

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Animator_Interim_Do_proc(Am_Object *interp)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Object_Method method;
  int local_24;
  undefined1 local_20 [4];
  int curr_phase;
  Am_Value_List values;
  Am_Object *interp_local;
  
  values.item = (Am_List_Item *)interp;
  pAVar3 = Am_Object::Get(interp,0xfa,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20,pAVar3);
  pAVar3 = Am_Object::Get(interp,0xfb,0);
  local_24 = Am_Value::operator_cast_to_int(pAVar3);
  uVar2 = Am_Value_List::Length((Am_Value_List *)local_20);
  if (local_24 < (int)(uVar2 - 1)) {
    local_24 = local_24 + 1;
    Am_Object::Set(interp,0xfb,local_24,0);
  }
  uVar2 = Am_Value_List::Length((Am_Value_List *)local_20);
  if (local_24 < (int)(uVar2 - 1)) {
    Am_Object::Am_Object((Am_Object *)&method.Call,interp);
    Am_Stop_Timer((Am_Object *)&method.Call,0xe8);
    Am_Object::~Am_Object((Am_Object *)&method.Call);
    Am_Value_List::Move_Nth((Am_Value_List *)local_20,local_24);
    pAVar3 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::Set(interp,0x181,pAVar3,0);
    Am_Value_List::Next((Am_Value_List *)local_20);
    pAVar3 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::Set(interp,0x182,pAVar3,0);
    pAVar3 = Am_Object::Get(interp,199,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_50,pAVar3);
    bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_50);
    if (bVar1) {
      Am_Object::Am_Object(&local_58,interp);
      (*(code *)method.from_wrapper)(&local_58);
      Am_Object::~Am_Object(&local_58);
    }
  }
  else {
    Am_Object::Am_Object(&local_60,interp);
    Am_Stop_Animator(&local_60);
    Am_Object::~Am_Object(&local_60);
  }
  Am_Object::Am_Object(&local_68,interp);
  Am_Set_Animated_Slots(&local_68);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Interim_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Animator Interim Do of " << interp);

  Am_Value_List values = interp.Get(Am_VALUES);
  int curr_phase = interp.Get(Am_CURRENT_PHASE);

  if (curr_phase < ((int)values.Length()) - 1) {
    ++curr_phase;
    interp.Set(Am_CURRENT_PHASE, curr_phase);
  }

  if (curr_phase < ((int)values.Length()) - 1) {
    Am_Stop_Timer(interp, Am_ANIMATION_METHOD);

    values.Move_Nth(curr_phase);
    interp.Set(Am_VALUE_1, values.Get());
    values.Next();
    interp.Set(Am_VALUE_2, values.Get());

    Am_Object_Method method = interp.Get(Am_START_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  } else {
    Am_Stop_Animator(interp);
  }

  Am_Set_Animated_Slots(interp);
}